

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  ssize_t sVar1;
  int *piVar2;
  size_t in_RCX;
  
  do {
    while( true ) {
      if (in_RCX == 0) {
        (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
        return (Status)(char *)this;
      }
      sVar1 = write(*(int *)(data + 0x10010),(void *)size,in_RCX);
      if (sVar1 < 0) break;
      size = size + sVar1;
      in_RCX = in_RCX - sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  PosixError((anon_unknown_1 *)this,(string *)(data + 0x10018),*piVar2);
  return (Status)(char *)this;
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }